

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledRgbaFile.cpp
# Opt level: O1

void __thiscall
Imf_3_4::TiledRgbaOutputFile::writeTiles
          (TiledRgbaOutputFile *this,int dxMin,int dxMax,int dyMin,int dyMax,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  bool bVar2;
  
  __mutex = (pthread_mutex_t *)this->_toYa;
  if (__mutex == (pthread_mutex_t *)0x0) {
    TiledOutputFile::writeTiles(this->_outputFile,dxMin,dxMax,dyMin,dyMax,lx,ly);
    return;
  }
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    if (dyMin <= dyMax) {
      do {
        iVar1 = dxMin;
        if (dxMin <= dxMax) {
          do {
            ToYa::writeTile(this->_toYa,iVar1,dyMin,lx,ly);
            iVar1 = iVar1 + 1;
          } while (dxMax + 1 != iVar1);
        }
        bVar2 = dyMin != dyMax;
        dyMin = dyMin + 1;
      } while (bVar2);
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void
TiledRgbaOutputFile::writeTiles (
    int dxMin, int dxMax, int dyMin, int dyMax, int lx, int ly)
{
    if (_toYa)
    {
#if ILMTHREAD_THREADING_ENABLED
        std::lock_guard<std::mutex> lock (*_toYa);
#endif
        for (int dy = dyMin; dy <= dyMax; dy++)
            for (int dx = dxMin; dx <= dxMax; dx++)
                _toYa->writeTile (dx, dy, lx, ly);
    }
    else { _outputFile->writeTiles (dxMin, dxMax, dyMin, dyMax, lx, ly); }
}